

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void mzd_to_char_array(uint8_t *dst,mzd_local_t *data,size_t len)

{
  ulong in_RDX;
  long in_RSI;
  void *in_RDI;
  uint64_t tmp;
  size_t i;
  block_t *block;
  size_t word_count;
  size_t local_48;
  __uint64_t local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  ulong local_18;
  void *local_8;
  
  local_30 = in_RDX + 7 >> 3;
  local_28 = in_RSI;
  local_20 = local_30;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (; local_30 != 0; local_30 = local_30 - 1) {
    local_38 = __bswap_64(*(__uint64_t *)(local_28 + (local_30 - 1) * 8));
    if (local_18 < 9) {
      local_48 = local_18;
    }
    else {
      local_48 = 8;
    }
    memcpy(local_8,&local_38,local_48);
    local_8 = (void *)((long)local_8 + 8);
    local_18 = local_18 - 8;
  }
  return;
}

Assistant:

void mzd_to_char_array(uint8_t* dst, const mzd_local_t* data, size_t len) {
  const size_t word_count = (len + 7) / sizeof(uint64_t);
  const block_t* block    = CONST_BLOCK(data, 0);

  for (size_t i = word_count; i; --i, dst += sizeof(uint64_t), len -= sizeof(uint64_t)) {
    const uint64_t tmp = htobe64(block->w64[i - 1]);
    memcpy(dst, &tmp, MIN(sizeof(tmp), len));
  }
}